

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall doctest::String::operator+=(String *this,String *other)

{
  byte bVar1;
  byte bVar2;
  char *__src;
  uint uVar3;
  char *pcVar4;
  ulong __n;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  bVar1 = (this->field_0).buf[0x17];
  uVar6 = 0x17 - (bVar1 & 0x1f);
  uVar5 = (this->field_0).data.size;
  __n = (ulong)uVar5;
  if (-1 < (char)bVar1) {
    uVar5 = uVar6;
  }
  bVar2 = (other->field_0).buf[0x17];
  if ((char)bVar2 < '\0') {
    uVar7 = (other->field_0).data.size;
  }
  else {
    uVar7 = 0x17 - (bVar2 & 0x1f);
  }
  uVar5 = uVar5 + uVar7;
  if ((char)bVar1 < '\0') {
    uVar6 = (this->field_0).data.capacity;
    if (uVar5 < uVar6) {
      (this->field_0).data.size = uVar5;
      pcVar4 = (this->field_0).data.ptr + __n;
      if ((other->field_0).buf[0x17] < '\0') {
        other = (String *)(other->field_0).data.ptr;
      }
      goto LAB_00107ab4;
    }
    uVar6 = uVar6 * 2;
    uVar3 = uVar5 + 1;
    if (uVar5 < uVar6) {
      uVar3 = uVar6;
    }
    (this->field_0).data.capacity = uVar3;
    pcVar4 = (char *)operator_new__((ulong)uVar3);
    __src = (this->field_0).data.ptr;
    memcpy(pcVar4,__src,__n);
    if (__src != (char *)0x0) {
      operator_delete__(__src);
    }
    (this->field_0).data.size = uVar5;
    (this->field_0).data.ptr = pcVar4;
    pcVar4 = pcVar4 + __n;
  }
  else {
    if (uVar5 < 0x18) {
      if ((char)bVar2 < '\0') {
        other = (String *)(other->field_0).data.ptr;
      }
      memcpy((void *)((long)&this->field_0 + (ulong)uVar6),other,(ulong)(uVar7 + 1));
      (this->field_0).buf[0x17] = '\x17' - (char)uVar5;
      return this;
    }
    pcVar4 = (char *)operator_new__((ulong)(uVar5 + 1));
    memcpy(pcVar4,this,(ulong)uVar6);
    (this->field_0).buf[0x17] = -0x80;
    (this->field_0).data.size = uVar5;
    (this->field_0).data.capacity = uVar5 + 1;
    (this->field_0).data.ptr = pcVar4;
    pcVar4 = pcVar4 + uVar6;
  }
  if ((other->field_0).buf[0x17] < '\0') {
    other = (String *)(other->field_0).data.ptr;
  }
LAB_00107ab4:
  memcpy(pcVar4,other,(ulong)(uVar7 + 1));
  return this;
}

Assistant:

String& String::operator+=(const String& other) {
    const unsigned my_old_size = size();
    const unsigned other_size  = other.size();
    const unsigned total_size  = my_old_size + other_size;
    using namespace std;
    if(isOnStack()) {
        if(total_size < len) {
            // append to the current stack space
            memcpy(buf + my_old_size, other.c_str(), other_size + 1);
            // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
            setLast(last - total_size);
        } else {
            // alloc new chunk
            char* temp = new char[total_size + 1];
            // copy current data to new location before writing in the union
            memcpy(temp, buf, my_old_size); // skip the +1 ('\0') for speed
            // update data in union
            setOnHeap();
            data.size     = total_size;
            data.capacity = data.size + 1;
            data.ptr      = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    } else {
        if(data.capacity > total_size) {
            // append to the current heap block
            data.size = total_size;
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        } else {
            // resize
            data.capacity *= 2;
            if(data.capacity <= total_size)
                data.capacity = total_size + 1;
            // alloc new chunk
            char* temp = new char[data.capacity];
            // copy current data to new location before releasing it
            memcpy(temp, data.ptr, my_old_size); // skip the +1 ('\0') for speed
            // release old chunk
            delete[] data.ptr;
            // update the rest of the union members
            data.size = total_size;
            data.ptr  = temp;
            // transfer the rest of the data
            memcpy(data.ptr + my_old_size, other.c_str(), other_size + 1);
        }
    }

    return *this;
}